

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UsageSlopeTestCase::testPolygonOffset
          (UsageSlopeTestCase *this)

{
  code *pcVar1;
  TestContext *testCtx;
  undefined *puVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  TestLog *this_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestError *this_01;
  MessageBuilder *pMVar7;
  ConstPixelBufferAccess local_c70;
  ConstPixelBufferAccess local_c48;
  Vector<float,_4> local_c20;
  PixelBufferAccess local_c10;
  MessageBuilder local_be8;
  PixelBufferAccess local_a68;
  MessageBuilder local_a40;
  MessageBuilder local_8c0;
  MessageBuilder local_740;
  MessageBuilder local_5c0;
  MessageBuilder local_440;
  undefined4 local_2bc;
  undefined4 local_2b8;
  GLint colorLoc;
  GLint positionLoc;
  allocator<char> local_289;
  string local_288;
  ProgramSources local_268;
  undefined1 local_198 [8];
  ShaderProgram program;
  Functions *gl;
  undefined1 local_b0 [8];
  Surface referenceImage;
  Surface testImage;
  TestLog *log;
  Vec4 triangleTopLeft [3];
  Vec4 triangleBottomRight [3];
  UsageSlopeTestCase *this_local;
  
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangleTopLeft[2].m_data + 2),-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangleBottomRight[0].m_data + 2),1.0,1.0,0.9,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangleBottomRight[1].m_data + 2),1.0,-1.0,0.9,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&log,-1.0,-1.0,-0.9,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangleTopLeft[0].m_data + 2),-1.0,1.0,0.9,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(triangleTopLeft[1].m_data + 2),1.0,-1.0,0.0,1.0);
  this_00 = tcu::TestContext::getLog
                      ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)&referenceImage.m_pixels.m_cap,iVar4,iVar4);
  iVar4 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface((Surface *)local_b0,iVar4,iVar4);
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceVertex;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,puVar2,&local_289);
  puVar2 = Functional::(anonymous_namespace)::s_shaderSourceFragment;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&positionLoc,puVar2,(allocator<char> *)((long)&colorLoc + 3));
  glu::makeVtxFragSources(&local_268,&local_288,(string *)&positionLoc);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_198,pRVar6,&local_268);
  glu::ProgramSources::~ProgramSources(&local_268);
  std::__cxx11::string::~string((string *)&positionLoc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&colorLoc + 3));
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_198);
  local_2b8 = (*pcVar1)(dVar5,"a_position");
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x780);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_198);
  local_2bc = (*pcVar1)(dVar5,"a_color");
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_198);
  if (!bVar3) {
    glu::operator<<(this_00,(ShaderProgram *)local_198);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Shader compile failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPolygonOffsetTests.cpp"
               ,0x378);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1d0))(0x3f800000);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x188))(0x4100);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1a00))
            (0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_198);
  (*pcVar1)(dVar5);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0xb71);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x5e0))(0x8037);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x610))(local_2b8);
  tcu::TestLog::operator<<(&local_440,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_440,(char (*) [29])0x2b8d9b3);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_440);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x19f0))(local_2b8,4,0x1406,0,0,&log);
  tcu::TestLog::operator<<(&local_5c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_5c0,
                      (char (*) [78])
                      "Draw top-left. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 0)."
                     );
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5c0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x207);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))
            (0x3f800000,0x3f800000,0x3f800000,local_2bc);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  tcu::TestLog::operator<<(&local_740,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_740,
                      (char (*) [77])
                      "Draw top-left. Color = Green.\tState: DepthFunc = LESS, PolygonOffset(-1, 0)."
                     );
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_740);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x201);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0xbf800000,0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0,0x3f800000,local_2bc);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x19f0))
            (local_2b8,4,0x1406,0,0,triangleTopLeft[2].m_data + 2);
  tcu::TestLog::operator<<(&local_8c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_8c0,
                      (char (*) [82])
                      "Draw bottom-right. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 0)."
                     );
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8c0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x207);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0x3f800000,0x3f800000,local_2bc);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  tcu::TestLog::operator<<(&local_a40,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_a40,
                      (char (*) [83])
                      "Draw bottom-right. Color = Green.\tState: DepthFunc = GREATER, PolygonOffset(1, 0)."
                     );
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a40);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x4a0))(0x204);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1028))(0x3f800000,0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1858))(0,0x3f800000,local_2bc);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x538))(4,0,3);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x518))(local_2b8);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1680))(0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x648))();
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess(&local_a68,(Surface *)&referenceImage.m_pixels.m_cap);
  glu::readPixels(pRVar6,0,0,&local_a68);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_198);
  tcu::TestLog::operator<<(&local_be8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     (&local_be8,(char (*) [51])"Expecting: Top-left = Green, Bottom-right = Green."
                     );
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_be8);
  tcu::Surface::getAccess(&local_c10,(Surface *)local_b0);
  tcu::Vector<float,_4>::Vector(&local_c20,0.0,1.0,0.0,1.0);
  tcu::clear(&local_c10,&local_c20);
  testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  pRVar6 = gles3::Context::getRenderContext
                     ((this->super_PolygonOffsetTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_c48,(Surface *)&referenceImage.m_pixels.m_cap)
  ;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_c70,(Surface *)local_b0);
  verifyImages(this_00,testCtx,pRVar6,&local_c48,&local_c70);
  tcu::Surface::~Surface((Surface *)local_b0);
  tcu::Surface::~Surface((Surface *)&referenceImage.m_pixels.m_cap);
  return;
}

Assistant:

void UsageSlopeTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangleBottomRight[] =
	{
		tcu::Vec4(-1,  1,  0.0f,  1),
		tcu::Vec4( 1,  1,  0.9f,  1),
		tcu::Vec4( 1, -1,  0.9f,  1),
	};
	const tcu::Vec4 triangleTopLeft[] =
	{
		tcu::Vec4(-1, -1,  -0.9f,  1),
		tcu::Vec4(-1,  1,   0.9f,  1),
		tcu::Vec4( 1, -1,   0.0f,  1),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		//draw top left (negative offset test)
		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangleTopLeft);

			log << TestLog::Message << "Draw top-left. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 0);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw top-left. Color = Green.\tState: DepthFunc = LESS, PolygonOffset(-1, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_LESS);
			gl.polygonOffset			(-1, 0);
			gl.vertexAttrib4f			(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		//draw bottom right (positive offset test)
		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangleBottomRight);

			log << TestLog::Message << "Draw bottom-right. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 0);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw bottom-right. Color = Green.\tState: DepthFunc = GREATER, PolygonOffset(1, 0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_GREATER);
			gl.polygonOffset			(1, 0);
			gl.vertexAttrib4f			(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting: Top-left = Green, Bottom-right = Green." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}